

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::outputBits(int nBits,Int64 bits,Int64 *c,int *lc,char **out)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char **out_local;
  int *lc_local;
  Int64 *c_local;
  Int64 bits_local;
  int nBits_local;
  
  *c = *c << ((byte)nBits & 0x3f);
  *lc = nBits + *lc;
  *c = bits | *c;
  while (7 < *lc) {
    uVar2 = *c;
    iVar1 = *lc;
    *lc = iVar1 + -8;
    pcVar3 = *out;
    *out = pcVar3 + 1;
    *pcVar3 = (char)(uVar2 >> ((byte)(iVar1 + -8) & 0x3f));
  }
  return;
}

Assistant:

inline void
outputBits (int nBits, Int64 bits, Int64 &c, int &lc, char *&out)
{
    c <<= nBits;
    lc += nBits;

    c |= bits;

    while (lc >= 8)
	*out++ = (c >> (lc -= 8));
}